

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsCompiler.cxx
# Opt level: O2

void __thiscall
cmDependsCompiler::WriteDependencies
          (cmDependsCompiler *this,DependencyMap *dependencies,ostream *makeDepends,
          ostream *internalDepends)

{
  char cVar1;
  cmGlobalGenerator *pcVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  __node_base *p_Var7;
  bool bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dep;
  _Base_ptr p_Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dep_1;
  string target;
  string local_d8;
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  phonyTargets;
  DependencyMap makeDependencies;
  string local_50;
  
  pcVar2 = (this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
           GlobalGenerator;
  cVar1 = *(char *)((long)&pcVar2[1].LocalGenerators.
                           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 4);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::_Rb_tree(&makeDependencies._M_t,&dependencies->_M_t);
  phonyTargets._M_h._M_buckets = &phonyTargets._M_h._M_single_bucket;
  phonyTargets._M_h._M_bucket_count = 1;
  phonyTargets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  phonyTargets._M_h._M_element_count = 0;
  phonyTargets._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  phonyTargets._M_h._M_rehash_policy._M_next_resize = 0;
  phonyTargets._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (p_Var6 = makeDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &makeDependencies._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    pcVar3 = this->LocalGenerator;
    cmOutputConverter::MaybeRelativeToTopBinDir
              (&local_d8,(cmOutputConverter *)pcVar3,(string *)(p_Var6 + 1));
    cmLocalUnixMakefileGenerator3::ConvertToMakefilePath(&target,pcVar3,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    p_Var4 = p_Var6[2]._M_parent;
    for (p_Var9 = *(_Base_ptr *)(p_Var6 + 2); p_Var9 != p_Var4; p_Var9 = p_Var9 + 1) {
      pcVar3 = this->LocalGenerator;
      cmOutputConverter::MaybeRelativeToTopBinDir
                (&local_d8,(cmOutputConverter *)pcVar3,(string *)p_Var9);
      cmLocalUnixMakefileGenerator3::ConvertToMakefilePath(&local_50,pcVar3,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::operator=((string *)p_Var9,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (cVar1 != '\0') {
      poVar5 = std::operator<<(makeDepends,(string *)&target);
      std::operator<<(poVar5,": ");
    }
    p_Var4 = p_Var6[2]._M_parent;
    bVar8 = true;
    for (p_Var9 = *(_Base_ptr *)(p_Var6 + 2); p_Var9 != p_Var4; p_Var9 = p_Var9 + 1) {
      if (cVar1 == '\0') {
        poVar5 = std::operator<<(makeDepends,(string *)&target);
        poVar5 = std::operator<<(poVar5,": ");
        poVar5 = std::operator<<(poVar5,(string *)p_Var9);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      else {
        poVar5 = makeDepends;
        if (!bVar8) {
          poVar5 = std::operator<<(makeDepends,' ');
          poVar5 = std::operator<<(poVar5,(string *)&pcVar2[1].Makefiles);
          poVar5 = std::operator<<(poVar5,"  ");
        }
        std::operator<<(poVar5,(string *)p_Var9);
        bVar8 = false;
      }
      local_d8._M_dataplus._M_p = *(pointer *)p_Var9;
      local_50._M_dataplus._M_p = (pointer)p_Var9->_M_parent;
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_M_emplace<char_const*,unsigned_long>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&phonyTargets,&local_d8,&local_50);
    }
    poVar5 = std::endl<char,std::char_traits<char>>(makeDepends);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&target);
  }
  p_Var7 = &phonyTargets._M_h._M_before_begin;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    poVar5 = std::endl<char,std::char_traits<char>>(makeDepends);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)*(_Hash_node_base **)
                                        &((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor,
                        (long)p_Var7[1]._M_nxt);
    poVar5 = std::operator<<(poVar5,':');
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  for (p_Var6 = (dependencies->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(dependencies->_M_t)._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    poVar5 = std::operator<<(internalDepends,(string *)(p_Var6 + 1));
    std::endl<char,std::char_traits<char>>(poVar5);
    p_Var4 = p_Var6[2]._M_parent;
    for (p_Var9 = *(_Base_ptr *)(p_Var6 + 2); p_Var9 != p_Var4; p_Var9 = p_Var9 + 1) {
      poVar5 = std::operator<<(internalDepends,' ');
      poVar5 = std::operator<<(poVar5,(string *)p_Var9);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    std::endl<char,std::char_traits<char>>(internalDepends);
  }
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&phonyTargets._M_h);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&makeDependencies._M_t);
  return;
}

Assistant:

void cmDependsCompiler::WriteDependencies(
  const cmDepends::DependencyMap& dependencies, std::ostream& makeDepends,
  std::ostream& internalDepends)
{
  // dependencies file consumed by make tool
  const auto& lineContinue = static_cast<cmGlobalUnixMakefileGenerator3*>(
                               this->LocalGenerator->GetGlobalGenerator())
                               ->LineContinueDirective;
  bool supportLongLineDepend = static_cast<cmGlobalUnixMakefileGenerator3*>(
                                 this->LocalGenerator->GetGlobalGenerator())
                                 ->SupportsLongLineDependencies();
  cmDepends::DependencyMap makeDependencies(dependencies);
  std::unordered_set<cm::string_view> phonyTargets;

  // external dependencies file
  for (auto& node : makeDependencies) {
    auto target = this->LocalGenerator->ConvertToMakefilePath(
      this->LocalGenerator->MaybeRelativeToTopBinDir(node.first));
    auto& deps = node.second;
    std::transform(deps.cbegin(), deps.cend(), deps.begin(),
                   [this](const std::string& dep) {
                     return this->LocalGenerator->ConvertToMakefilePath(
                       this->LocalGenerator->MaybeRelativeToTopBinDir(dep));
                   });

    bool first_dep = true;
    if (supportLongLineDepend) {
      makeDepends << target << ": ";
    }
    for (const auto& dep : deps) {
      if (supportLongLineDepend) {
        if (first_dep) {
          first_dep = false;
          makeDepends << dep;
        } else {
          makeDepends << ' ' << lineContinue << "  " << dep;
        }
      } else {
        makeDepends << target << ": " << dep << std::endl;
      }

      phonyTargets.emplace(dep.data(), dep.length());
    }
    makeDepends << std::endl << std::endl;
  }

  // add phony targets
  for (const auto& target : phonyTargets) {
    makeDepends << std::endl << target << ':' << std::endl;
  }

  // internal dependencies file
  for (const auto& node : dependencies) {
    internalDepends << node.first << std::endl;
    for (const auto& dep : node.second) {
      internalDepends << ' ' << dep << std::endl;
    }
    internalDepends << std::endl;
  }
}